

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

void AM_LevelInit(void)

{
  double dVar1;
  vertex_t *pvVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  char *name;
  double *pdVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  
  name = ((level.info)->MapBackground).Chars;
  if (*(int *)(name + -0xc) == 0) {
    name = "AUTOPAGE";
  }
  mapback = FTextureManager::CheckForTexture(&TexMan,name,8,1);
  lVar4 = 0xa0;
  do {
    *(undefined8 *)((long)&scale_ftom + lVar4) = 0xbff0000000000000;
    pvVar2 = vertexes;
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != 0);
  markpointnum = 0;
  min_y = 3.4028234663852886e+38;
  min_x = 3.4028234663852886e+38;
  max_y = -2147483648.0;
  max_x = -2147483648.0;
  lVar4 = (long)numvertexes;
  if (0 < lVar4) {
    dVar9 = -2147483648.0;
    dVar8 = 3.4028234663852886e+38;
    lVar5 = 0;
    uVar10 = 0xe0000000;
    uVar11 = 0x47efffff;
    dVar12 = -2147483648.0;
    do {
      dVar1 = *(double *)((long)&(pvVar2->p).X + lVar5);
      if (dVar8 <= dVar1) {
        pdVar6 = &max_x;
        dVar3 = dVar1;
        if (dVar9 < dVar1) goto LAB_00344a35;
      }
      else {
        pdVar6 = &min_x;
        dVar3 = dVar9;
        dVar8 = dVar1;
LAB_00344a35:
        dVar9 = dVar3;
        *pdVar6 = dVar1;
      }
      dVar1 = *(double *)((long)&(pvVar2->p).Y + lVar5);
      if ((double)CONCAT44(uVar11,uVar10) < dVar1 || (double)CONCAT44(uVar11,uVar10) == dVar1) {
        pdVar6 = &max_y;
        dVar3 = dVar1;
        if (dVar12 < dVar1) goto LAB_00344a64;
      }
      else {
        pdVar6 = &min_y;
        uVar10 = SUB84(dVar1,0);
        uVar11 = (undefined4)((ulong)dVar1 >> 0x20);
        dVar3 = dVar12;
LAB_00344a64:
        dVar12 = dVar3;
        *pdVar6 = dVar1;
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar4 * 0x10 != lVar5);
  }
  max_w = max_x - min_x;
  max_h = max_y - min_y;
  min_scale_mtof = (double)(screen->super_DSimpleCanvas).super_DCanvas.Width / max_w;
  if ((double)ST_Y / max_h <= min_scale_mtof) {
    min_scale_mtof = (double)ST_Y / max_h;
  }
  max_scale_mtof = (double)(screen->super_DSimpleCanvas).super_DCanvas.Height * 0.03125;
  uVar7 = -(ulong)(max_scale_mtof < min_scale_mtof / 0.7);
  scale_mtof = (double)(~uVar7 & (ulong)(min_scale_mtof / 0.7) | (ulong)min_scale_mtof & uVar7);
  scale_ftom = 1.0 / scale_mtof;
  if (am_showalllines.super_FBaseCVar.m_Callback == (_func_void_FBaseCVar_ptr *)0x0) {
    return;
  }
  (*am_showalllines.super_FBaseCVar.m_Callback)(&am_showalllines.super_FBaseCVar);
  return;
}

Assistant:

void AM_LevelInit ()
{
	if (level.info->MapBackground.Len() == 0)
	{
		mapback = TexMan.CheckForTexture("AUTOPAGE", FTexture::TEX_MiscPatch);
	}
	else
	{
		mapback = TexMan.CheckForTexture(level.info->MapBackground, FTexture::TEX_MiscPatch);
	}

	AM_clearMarks();

	AM_findMinMaxBoundaries();
	scale_mtof = min_scale_mtof / 0.7;
	if (scale_mtof > max_scale_mtof)
		scale_mtof = min_scale_mtof;
	scale_ftom = 1 / scale_mtof;

	am_showalllines.Callback();
}